

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O0

Abc_Obj_t * Abc_NtkMulti_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNodeOld)

{
  int iVar1;
  Vec_Ptr_t *vCone_00;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin;
  DdNode *pDVar2;
  int local_34;
  int i;
  Abc_Obj_t *pNodeNew;
  Vec_Ptr_t *vCone;
  Abc_Obj_t *pNodeOld_local;
  Abc_Ntk_t *pNtkNew_local;
  
  iVar1 = Abc_ObjIsComplement(pNodeOld);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0xb5,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  if ((pNodeOld->field_6).pTemp == (void *)0x0) {
    iVar1 = Abc_ObjIsNode(pNodeOld);
    if (iVar1 == 0) {
      __assert_fail("Abc_ObjIsNode(pNodeOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0xb9,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    iVar1 = Abc_AigNodeIsConst(pNodeOld);
    if (iVar1 != 0) {
      __assert_fail("!Abc_AigNodeIsConst(pNodeOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0xba,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    if ((*(uint *)&pNodeOld->field_0x14 >> 4 & 1) == 0) {
      __assert_fail("pNodeOld->fMarkA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0xbb,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    vCone_00 = Vec_PtrAlloc(10);
    Abc_NtkMultiCone(pNodeOld,vCone_00);
    pObj = Abc_NtkCreateNode(pNtkNew);
    for (local_34 = 0; local_34 < vCone_00->nSize; local_34 = local_34 + 1) {
      pFanin = Abc_NtkMulti_rec(pNtkNew,(Abc_Obj_t *)vCone_00->pArray[local_34]);
      Abc_ObjAddFanin(pObj,pFanin);
    }
    pDVar2 = Abc_NtkMultiDeriveBdd((DdManager *)pNtkNew->pManFunc,pNodeOld,vCone_00);
    (pObj->field_5).pData = pDVar2;
    Cudd_Ref((DdNode *)(pObj->field_5).pData);
    Vec_PtrFree(vCone_00);
    (pNodeOld->field_6).pCopy = pObj;
    pNtkNew_local = (Abc_Ntk_t *)(pNodeOld->field_6).pCopy;
  }
  else {
    pNtkNew_local = (Abc_Ntk_t *)(pNodeOld->field_6).pCopy;
  }
  return (Abc_Obj_t *)pNtkNew_local;
}

Assistant:

Abc_Obj_t * Abc_NtkMulti_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNodeOld )
{
    Vec_Ptr_t * vCone;
    Abc_Obj_t * pNodeNew;
    int i;

    assert( !Abc_ObjIsComplement(pNodeOld) );
    // return if the result if known
    if ( pNodeOld->pCopy )
        return pNodeOld->pCopy;
    assert( Abc_ObjIsNode(pNodeOld) );
    assert( !Abc_AigNodeIsConst(pNodeOld) );
    assert( pNodeOld->fMarkA );

//printf( "%d ", Abc_NodeMffcSizeSupp(pNodeOld) );

    // collect the renoding cone
    vCone = Vec_PtrAlloc( 10 );
    Abc_NtkMultiCone( pNodeOld, vCone );

    // create a new node 
    pNodeNew = Abc_NtkCreateNode( pNtkNew ); 
    for ( i = 0; i < vCone->nSize; i++ )
        Abc_ObjAddFanin( pNodeNew, Abc_NtkMulti_rec(pNtkNew, (Abc_Obj_t *)vCone->pArray[i]) );

    // derive the function of this node
    pNodeNew->pData = Abc_NtkMultiDeriveBdd( (DdManager *)pNtkNew->pManFunc, pNodeOld, vCone );    
    Cudd_Ref( (DdNode *)pNodeNew->pData );
    Vec_PtrFree( vCone );

    // remember the node
    pNodeOld->pCopy = pNodeNew;
    return pNodeOld->pCopy;
}